

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

void __thiscall FC_BPNN::clear(FC_BPNN *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  int local_18;
  int local_14;
  int j;
  int i;
  FC_BPNN *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->layers_value);
    if (sVar1 <= (ulong)(long)local_14) break;
    local_18 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->layers_value,(long)local_14);
      sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
      if (sVar1 <= (ulong)(long)local_18) break;
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->layers_value,(long)local_14);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_18);
      *pvVar3 = 0.0;
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->layers_error,(long)local_14);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_18);
      *pvVar3 = 0.0;
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void FC_BPNN::clear()
{
	for (int i = 0; i < layers_value.size(); i++) {
		for (int j = 0; j < layers_value[i].size(); j++) {
			layers_value[i][j] = 0.0;
			layers_error[i][j] = 0.0;
		}
	}
}